

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::setProperty(FederateState *this,int timeProperty,Time propertyVal)

{
  _Impl *this_00;
  long lVar1;
  MessageTimer *this_01;
  int32_t iVar2;
  pointer p_Var3;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1b8;
  __shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  ActionMessage grantCheck;
  ActionMessage local_e0;
  
  if (timeProperty == 0xa1) {
    lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
    (this->grantTimeOutPeriod).internalTimeCode = propertyVal.internalTimeCode;
    if (lVar1 == 0) {
      if ((((this->state)._M_i != CREATED) && (0 < (this->grantTimeOutPeriod).internalTimeCode)) &&
         ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0)) {
        p_Var3 = std::
                 allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
                 ::allocate(&__a2,1);
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00456d00;
        this_00 = &p_Var3->_M_impl;
        grantCheck.source_id.gid = 0;
        grantCheck.source_handle.hid = 0;
        grantCheck._24_8_ =
             std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:2056:69)>
             ::_M_invoke;
        grantCheck._16_8_ =
             std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:2056:69)>
             ::_M_manager;
        local_1b8._M_alloc = &__a2;
        local_1b8._M_ptr = p_Var3;
        grantCheck._0_8_ = this;
        MessageTimer::MessageTimer
                  ((MessageTimer *)this_00,(function<void_(helics::ActionMessage_&&)> *)&grantCheck)
        ;
        CLI::std::_Function_base::~_Function_base((_Function_base *)&grantCheck);
        local_1b8._M_ptr = (pointer)0x0;
        local_1a8._M_ptr = (element_type *)this_00;
        local_1a8._M_refcount._M_pi = &p_Var3->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr(&local_1b8);
        std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<helics::MessageTimer,helics::MessageTimer>
                  ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_1a8,
                   (MessageTimer *)this_00);
        std::__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->mTimer).
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>,&local_1a8)
        ;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1a8._M_refcount);
      }
      if (((this->state)._M_i == EXECUTING) && (this->timeGranted_mode == false)) {
        ActionMessage::ActionMessage(&grantCheck,cmd_grant_timeout_check);
        grantCheck.dest_handle.hid = this->mGrantCount;
        grantCheck._24_8_ = grantCheck._24_8_ & 0xffffffffffff0000;
        if (this->grantTimeoutTimeIndex < 0) {
          lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
          this_01 = (this->mTimer).
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ActionMessage::ActionMessage(&local_e0,&grantCheck);
          iVar2 = MessageTimer::addTimerFromNow
                            (this_01,(nanoseconds)(lVar1 - lVar1 % 1000000),&local_e0);
          this->grantTimeoutTimeIndex = iVar2;
          ActionMessage::~ActionMessage(&local_e0);
        }
        ActionMessage::~ActionMessage(&grantCheck);
      }
    }
    else if ((propertyVal.internalTimeCode < 1) && (-1 < this->grantTimeoutTimeIndex)) {
      MessageTimer::cancelTimer
                ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,this->grantTimeoutTimeIndex);
      return;
    }
  }
  else {
    if (timeProperty != 0x90) {
      if (timeProperty != 0x91) {
        if (timeProperty == 0x8f) {
          (this->rt_lag).internalTimeCode = propertyVal.internalTimeCode;
          return;
        }
        TimeCoordinator::setProperty
                  ((this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                   timeProperty,propertyVal);
        return;
      }
      (this->rt_lag).internalTimeCode = propertyVal.internalTimeCode;
    }
    (this->rt_lead).internalTimeCode = propertyVal.internalTimeCode;
  }
  return;
}

Assistant:

void FederateState::setProperty(int timeProperty, Time propertyVal)
{
    switch (timeProperty) {
        case defs::Properties::RT_LAG:
            rt_lag = propertyVal;
            break;
        case defs::Properties::RT_LEAD:
            rt_lead = propertyVal;
            break;
        case defs::Properties::RT_TOLERANCE:
            rt_lag = propertyVal;
            rt_lead = propertyVal;
            break;
        case defs::Properties::GRANT_TIMEOUT: {
#ifndef HELICS_DISABLE_ASIO
            auto prevTimeout = grantTimeOutPeriod;
            grantTimeOutPeriod = propertyVal;
            if (prevTimeout == timeZero) {
                if (getState() >= FederateStates::INITIALIZING && grantTimeOutPeriod > timeZero) {
                    if (!mTimer) {
                        if (!mTimer) {
                            mTimer = std::make_shared<MessageTimer>([this](ActionMessage&& mess) {
                                return this->addAction(std::move(mess));
                            });
                        }
                    }
                }
                // if we are currently waiting for a grant trigger the timer
                if (getState() == FederateStates::EXECUTING && !timeGranted_mode) {
                    ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
                    grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
                    grantCheck.counter = 0;
                    if (grantTimeoutTimeIndex < 0) {
                        grantTimeoutTimeIndex = mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(),
                                                                        std::move(grantCheck));
                    }
                }
            } else if (grantTimeOutPeriod <= timeZero && grantTimeoutTimeIndex >= 0) {
                mTimer->cancelTimer(grantTimeoutTimeIndex);
            }
#else
            grantTimeOutPeriod = propertyVal;
#endif
        } break;
        default:
            timeCoord->setProperty(timeProperty, propertyVal);
            break;
    }
}